

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

int Gia_ManFindXor(word **pSets,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vBinateVars,
                  Vec_Int_t **vUnatePairs,int fVerbose)

{
  Vec_Int_t *vUnatePairs_00;
  int iVar1;
  ulong uVar2;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  Vec_Ptr_t *pOn;
  ulong uVar3;
  
  uVar2 = (ulong)(uint)nWords;
  pOn = vDivs;
  if (fVerbose != 0) {
    printf("  ");
    uVar2 = extraout_RDX;
  }
  for (uVar3 = 0; uVar3 != 2; uVar3 = uVar3 + 1) {
    vUnatePairs_00 = vUnatePairs[uVar3];
    vUnatePairs_00->nSize = 0;
    Gia_ManFindXorInt(pSets[uVar3],(word *)pOn,vBinateVars,vDivs,nWords,vUnatePairs_00);
    uVar2 = extraout_RDX_00;
    if (fVerbose != 0) {
      pOn = (Vec_Ptr_t *)(uVar3 & 0xffffffff);
      printf("UX%d =%5d ",pOn,(ulong)(uint)vUnatePairs[uVar3]->nSize);
      uVar2 = extraout_RDX_01;
    }
  }
  iVar1 = Gia_ManFindFirstCommonLit(*vUnatePairs,vUnatePairs[1],(int)uVar2);
  return iVar1;
}

Assistant:

int Gia_ManFindXor( word * pSets[2], Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vBinateVars, Vec_Int_t * vUnatePairs[2], int fVerbose )
{
    int n;
    if ( fVerbose ) printf( "  " );
    for ( n = 0; n < 2; n++ )
    {
        Vec_IntClear( vUnatePairs[n] );
        Gia_ManFindXorInt( pSets[n], pSets[!n], vBinateVars, vDivs, nWords, vUnatePairs[n] );
        if ( fVerbose ) printf( "UX%d =%5d ", n, Vec_IntSize(vUnatePairs[n]) );
    }
    return Gia_ManFindFirstCommonLit( vUnatePairs[0], vUnatePairs[1], fVerbose );
}